

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O1

void __thiscall
capnp::JsonCodec::AnnotatedEnumHandler::encode
          (AnnotatedEnumHandler *this,JsonCodec *codec,DynamicEnum input,Builder output)

{
  StringPtr *pSVar1;
  char *pcVar2;
  size_t sVar3;
  Reader value;
  Fault local_80;
  DynamicEnum local_78;
  Maybe<capnp::EnumSchema::Enumerant> local_68;
  
  local_78.schema = input.schema.super_Schema.raw;
  local_78.value = input.value;
  DynamicEnum::getEnumerant(&local_68,&local_78);
  if (local_68.ptr.isSet == true) {
    if ((this->valueToName).size_ <= (local_68.ptr.field_1._8_8_ & 0xffff)) {
      local_80.exception = (Exception *)0x0;
      local_68.ptr._0_8_ = (SegmentBuilder *)0x0;
      local_68.ptr.field_1.value.parent.super_Schema.raw = (EnumSchema)(Schema)0x0;
      kj::_::Debug::Fault::init
                (&local_80,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
                );
      kj::_::Debug::Fault::fatal(&local_80);
    }
    pSVar1 = (this->valueToName).ptr;
    pcVar2 = pSVar1[local_68.ptr.field_1._8_8_ & 0xffff].content.ptr;
    sVar3 = pSVar1[local_68.ptr.field_1._8_8_ & 0xffff].content.size_;
    *(undefined2 *)output._builder.data = 3;
    local_68.ptr._0_8_ = output._builder.segment;
    local_68.ptr.field_1.value.parent.super_Schema.raw =
         (EnumSchema)(EnumSchema)output._builder.capTable;
    local_68.ptr.field_1._8_8_ = output._builder.pointers;
    value.super_StringPtr.content.size_ = sVar3;
    value.super_StringPtr.content.ptr = pcVar2;
    capnp::_::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_68,value);
  }
  else {
    *(undefined2 *)output._builder.data = 2;
    *(double *)((long)output._builder.data + 8) = (double)local_78.value;
  }
  return;
}

Assistant:

void encode(const JsonCodec& codec, DynamicEnum input, JsonValue::Builder output) const override {
    KJ_IF_MAYBE(e, input.getEnumerant()) {
      KJ_ASSERT(e->getIndex() < valueToName.size());
      output.setString(valueToName[e->getIndex()]);
    } else {
      output.setNumber(input.getRaw());
    }